

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsGramNode * __thiscall CTcPrsGramNodeOr::consolidate_or(CTcPrsGramNodeOr *this)

{
  CTcPrsGramNode **ppCVar1;
  CTcPrsGramNode *pCVar2;
  CTcPrsGramNode *pCVar3;
  CTcPrsGramNode *pCVar4;
  CTcPrsGramNode *pCVar5;
  int iVar6;
  undefined4 extraout_var;
  CTcPrsGramNode **ppCVar8;
  CTcPrsGramNode *pCVar7;
  
  pCVar7 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  (this->super_CTcPrsGramNodeWithChildren).sub_head_ = (CTcPrsGramNode *)0x0;
  (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = (CTcPrsGramNode *)0x0;
  if (pCVar7 != (CTcPrsGramNode *)0x0) {
    ppCVar1 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
    do {
      pCVar2 = pCVar7->next_;
      iVar6 = (*(pCVar7->super_CTcTokenSource)._vptr_CTcTokenSource[3])(pCVar7);
      pCVar7 = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar6);
      iVar6 = (*(pCVar7->super_CTcTokenSource)._vptr_CTcTokenSource[5])(pCVar7);
      if (iVar6 == 0) {
        pCVar5 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_;
        ppCVar8 = &pCVar5->next_;
        if (pCVar5 == (CTcPrsGramNode *)0x0) {
          ppCVar8 = ppCVar1;
        }
        *ppCVar8 = pCVar7;
        (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar7;
        pCVar7->next_ = (CTcPrsGramNode *)0x0;
      }
      else {
        pCVar5 = (CTcPrsGramNode *)pCVar7[1].super_CTcTokenSource._vptr_CTcTokenSource;
        while (pCVar5 != (CTcPrsGramNode *)0x0) {
          pCVar3 = pCVar5->next_;
          pCVar4 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_;
          ppCVar8 = &pCVar4->next_;
          if (pCVar4 == (CTcPrsGramNode *)0x0) {
            ppCVar8 = ppCVar1;
          }
          *ppCVar8 = pCVar5;
          (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar5;
          pCVar5->next_ = (CTcPrsGramNode *)0x0;
          pCVar5 = pCVar3;
        }
        pCVar7[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
        pCVar7[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
      }
      pCVar7 = pCVar2;
    } while (pCVar2 != (CTcPrsGramNode *)0x0);
  }
  return (CTcPrsGramNode *)this;
}

Assistant:

virtual CTcPrsGramNode *consolidate_or()
    {
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        CTcPrsGramNode *old_head;

        /*
         *   Consolidate OR's in all subtrees.  If any of our immediate
         *   children turn into OR's, simply pull their children into our OR
         *   list directly - OR(a, OR(b, c)) is equivalent to OR(a, b, c).
         *   
         *   Before we build the new list, stash away our entire subtree,
         *   since we'll rebuild the tree from the updated versions.  
         */
        old_head = sub_head_;
        sub_head_ = sub_tail_ = 0;

        /* run through our list and build the new, consolidated list */
        for (cur = old_head ; cur != 0 ; cur = nxt)
        {
            CTcPrsGramNode *new_sub;

            /* remember the next item in the old list */
            nxt = cur->next_;
            
            /* consolidate OR's in the subtree */
            new_sub = cur->consolidate_or();

            /* 
             *   if this is an OR node, add its children directly to us;
             *   otherwise, add the node itself
             */
            if (new_sub->is_or())
            {
                CTcPrsGramNodeOr *new_or;
                CTcPrsGramNode *chi;
                CTcPrsGramNode *next_chi;

                /* cast it */
                new_or = (CTcPrsGramNodeOr *)new_sub;

                /* add each of the sub-OR's children as our direct children */
                for (chi = new_or->sub_head_ ; chi != 0 ; chi = next_chi)
                {
                    /* remember the next child in the old sub-list */
                    next_chi = chi->next_;

                    /* move it directly to our list */
                    add_sub_item(chi);
                }

                /* the old OR item is now empty of children */
                new_or->sub_head_ = new_or->sub_tail_ = 0;
            }
            else
            {
                /* it's not an OR - add it directly to our list */
                add_sub_item(new_sub);
            }
        }

        /* return myself with no further changes */
        return this;
    }